

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O2

int pt_qry_event(pt_query_decoder *decoder,pt_event *uev,size_t size)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint8_t uVar7;
  undefined7 uVar8;
  int iVar9;
  int iVar10;
  size_t __n;
  
  if (size < 0x28 || (uev == (pt_event *)0x0 || decoder == (pt_query_decoder *)0x0)) {
    iVar10 = -2;
  }
  else {
    iVar9 = pt_tnt_cache_is_empty(&decoder->tnt);
    iVar10 = -8;
    if (((iVar9 != 0) && (iVar10 = decoder->status, -1 < decoder->status)) &&
       (iVar10 = -8, ((decoder->event).type & ~ptev_disabled) != ptev_tip)) {
      __n = 0x48;
      if (size < 0x48) {
        __n = size;
      }
      memcpy(uev,&decoder->event,__n);
      uVar1 = (decoder->evdec).time.base;
      uVar2 = (decoder->evdec).time.fc;
      uVar3 = (decoder->evdec).time.ctc;
      uVar4 = (decoder->evdec).time.ctc_cyc;
      uVar5 = (decoder->evdec).time.lost_mtc;
      uVar6 = (decoder->evdec).time.lost_cyc;
      uVar7 = (decoder->evdec).time.cbr;
      uVar8 = *(undefined7 *)&(decoder->evdec).time.field_0x29;
      (decoder->last_time).tsc = (decoder->evdec).time.tsc;
      (decoder->last_time).base = uVar1;
      (decoder->last_time).fc = uVar2;
      (decoder->last_time).ctc = uVar3;
      (decoder->last_time).ctc_cyc = uVar4;
      (decoder->last_time).lost_mtc = uVar5;
      (decoder->last_time).lost_cyc = uVar6;
      (decoder->last_time).cbr = uVar7;
      *(undefined7 *)&(decoder->last_time).field_0x29 = uVar8;
      pt_qry_fetch_event(decoder);
      iVar10 = pt_qry_status_flags(decoder);
      return iVar10;
    }
  }
  return iVar10;
}

Assistant:

int pt_qry_event(struct pt_query_decoder *decoder, struct pt_event *uev,
		 size_t size)
{
	const struct pt_event *ev;
	int errcode, status;

	if (!decoder || !uev)
		return -pte_invalid;

	if (size < offsetof(struct pt_event, variant))
		return -pte_invalid;

	/* We do not allow querying for events while there are still TNT
	 * bits to consume.
	 */
	if (!pt_tnt_cache_is_empty(&decoder->tnt))
		return -pte_bad_query;

	/* Report any deferred error. */
	errcode = decoder->status;
	if (errcode < 0)
		return errcode;

	ev = &decoder->event;

	status = pt_qry_event_pending(ev);
	if (status <= 0) {
		if (status < 0)
			return status;

		return -pte_bad_query;
	}

	/* Copy the event to the user.  Make sure we're not writing beyond the
	 * memory provided by the user.
	 *
	 * We might truncate details of an event but only for those events the
	 * user can't know about, anyway.
	 */
	if (sizeof(*uev) < size)
		size = sizeof(*uev);

	memcpy(uev, ev, size);

	/* Preserve the time at the event. */
	decoder->last_time = decoder->evdec.time;

	errcode = pt_qry_fetch_event(decoder);
	if (errcode < 0)
		return errcode;

	return pt_qry_status_flags(decoder);
}